

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,4u>::
execute<asio::detail::executor_function_view&>
          (basic_executor_type<std::allocator<void>,4u> *this,executor_function_view *f)

{
  bool bVar1;
  executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
  *op;
  allocator<void> *a;
  undefined1 local_58 [8];
  ptr p;
  std_fenced_block local_29;
  undefined1 local_28 [7];
  fenced_block b;
  function_type tmp;
  executor_function_view *f_local;
  basic_executor_type<std::allocator<void>,_4U> *this_local;
  
  if (((*(uint *)(this + 0xc) & 1) == 0) &&
     (bVar1 = detail::scheduler::can_dispatch(*(scheduler **)(*(long *)this + 8)), bVar1)) {
    detail::executor_function_view::executor_function_view<asio::detail::executor_function_view>
              ((executor_function_view *)local_28,f);
    detail::std_fenced_block::std_fenced_block(&local_29,full);
    asio_handler_invoke_helpers::
    invoke<asio::detail::executor_function_view,asio::detail::executor_function_view>
              ((executor_function_view *)local_28,(executor_function_view *)local_28);
    detail::std_fenced_block::~std_fenced_block(&local_29);
  }
  else {
    a = (allocator<void> *)(this + 8);
    local_58 = (undefined1  [8])a;
    op = detail::
         executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
         ::ptr::allocate(a);
    p.v = (void *)0x0;
    p.a = (allocator<void> *)op;
    detail::
    executor_op<asio::detail::executor_function_view,std::allocator<void>,asio::detail::scheduler_operation>
    ::executor_op<asio::detail::executor_function_view&>
              ((executor_op<asio::detail::executor_function_view,std::allocator<void>,asio::detail::scheduler_operation>
                *)op,f,a);
    p.v = op;
    detail::scheduler::post_immediate_completion
              (*(scheduler **)(*(long *)this + 8),&op->super_scheduler_operation,
               SUB41((*(uint *)(this + 0xc) & 2) >> 1,0));
    p.v = (void *)0x0;
    p.a = (allocator<void> *)0x0;
    detail::
    executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
    ::ptr::~ptr((ptr *)local_58);
  }
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits_ & blocking_never) == 0 && io_context_->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      io_context_->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = { detail::addressof(allocator_),
      op::ptr::allocate(allocator_), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f), allocator_);

  ASIO_HANDLER_CREATION((*io_context_, *p.p,
        "io_context", io_context_, 0, "execute"));

  io_context_->impl_.post_immediate_completion(p.p,
      (bits_ & relationship_continuation) != 0);
  p.v = p.p = 0;
}